

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signature.hpp
# Opt level: O2

ostream * Kernel::operator<<(ostream *out,Symbol *self)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(out,(string *)self);
  std::operator<<(poVar1,": ");
  if (self->_type == (OperatorType *)0x0) {
    std::operator<<(out,"<type not (yet) set>");
  }
  else {
    operator<<(out,self->_type);
  }
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const Signature::Symbol& self)
    { 
      out << self.name() << ": "; 
      if (self._type) {
        out << *self._type;
      } else {
        out << "<type not (yet) set>";
      }
      return out;
    }